

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeText.Common.cpp
# Opt level: O1

int PlatformAgnostic::UnicodeText::Internal::readNumber<char16_t_const>(char16_t **str)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  int iVar5;
  int unaff_R12D;
  int iVar6;
  int iVar7;
  
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  iVar7 = 0;
  do {
    if (9 < (ushort)(**str + L'￐')) {
      return iVar7;
    }
    iVar6 = (uint)(ushort)**str + iVar7 * 10 + -0x30;
    if (iVar7 < iVar6) {
LAB_00e665aa:
      *str = *str + 1;
      iVar5 = iVar6;
      iVar3 = unaff_R12D;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/PlatformAgnostic/Platform/Common/UnicodeText.Common.cpp"
                         ,0x3d,"(newNum > num)","newNum > num");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      iVar5 = iVar7;
      iVar3 = iVar7;
      if (iVar7 < iVar6) goto LAB_00e665aa;
    }
    bVar2 = iVar6 <= iVar7;
    iVar7 = iVar5;
    unaff_R12D = iVar3;
    if (bVar2) {
      return iVar3;
    }
  } while( true );
}

Assistant:

int readNumber(__inout CharType* &str)
            {
                int num = 0;

                // Count digits on each string
                while (isDigit(*str))
                {
                    int newNum = (num * 10) + (*str - '0');
                    Assert(newNum > num);
                    if (newNum <= num)
                    {
                        return num;
                    }

                    num = newNum;

                    str++;
                }

                return num;
            }